

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_tests.cpp
# Opt level: O2

void populate_arena(vector<const_char_*,_std::allocator<const_char_*>_> *devices)

{
  pointer ppcVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer ppcVar4;
  ostringstream command;
  char *local_1c0 [4];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,
                  "/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/tests/fake-sys/populate_arena.py"
                 );
  ppcVar1 = (devices->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar4 = (devices->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppcVar4 != ppcVar1; ppcVar4 = ppcVar4 + 1) {
    pcVar2 = *ppcVar4;
    poVar3 = std::operator<<((ostream *)local_1a0," ");
    std::operator<<(poVar3,pcVar2);
  }
  system(
        "/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/tests/fake-sys/clean_arena.py"
        );
  std::__cxx11::stringbuf::str();
  system(local_1c0[0]);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void populate_arena(const std::vector<const char*> &devices) {
    std::ostringstream command;
    command << FAKE_SYS "/populate_arena.py";
    for (auto d : devices) command << " " << d;

    system(FAKE_SYS "/clean_arena.py");
    system(command.str().c_str());
}